

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string<double>(string *__return_storage_ptr__,double *value)

{
  double *in_RDX;
  double *value_local;
  
  string_maker<double>::to_string_abi_cxx11_
            (__return_storage_ptr__,(string_maker<double> *)value,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}